

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTableGet(TranslateToFuzzReader *this,Type type)

{
  HeapType HVar1;
  long lVar2;
  TableGet *pTVar3;
  long lVar4;
  Name tableName;
  Type local_20;
  Type type_local;
  anon_class_8_1_8991fb9c makeTableGet;
  
  local_20.id = type.id;
  type_local.id = (uintptr_t)this;
  HVar1 = Type::getHeapType(&local_20);
  if (HVar1.id == 0x48) {
    lVar2 = 0x78;
    lVar4 = 0x70;
  }
  else {
    HVar1 = Type::getHeapType(&local_20);
    if (HVar1.id != 0x10) {
      wasm::handle_unreachable
                ("bad TableGet type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x1276);
    }
    lVar2 = 0x68;
    lVar4 = 0x60;
  }
  tableName.super_IString.str._M_str = *(char **)((long)&this->wasm + lVar2);
  tableName.super_IString.str._M_len = *(size_t *)((long)&this->wasm + lVar4);
  pTVar3 = TranslateToFuzzReader::makeTableGet::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&type_local,tableName);
  return (Expression *)pTVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeTableGet(Type type) {
  // Emit a get from the funcref table (which always exists) or the exnref one
  // (which might not, if EH is disabled).
  auto makeTableGet = [&](Name tableName) {
    auto* table = wasm.getTable(tableName);
    // Usually emit in-bounds gets, to avoid trapping, but rarely allow
    // anything.
    Expression* index;
    if (allowOOB && oneIn(10)) {
      index = make(table->addressType);
    } else {
      index = builder.makeConst(
        Literal::makeFromInt32(upTo(table->initial), table->addressType));
    }
    return builder.makeTableGet(tableName, index, table->type);
  };
  if (type.getHeapType() == HeapType::exn) {
    return makeTableGet(exnrefTableName);
  } else if (type.getHeapType() == HeapType::func) {
    return makeTableGet(funcrefTableName);
  } else {
    WASM_UNREACHABLE("bad TableGet type");
  }
}